

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFileLock(unixFile *pFile,flock *pLock)

{
  unixInodeInfo *puVar1;
  int iVar2;
  flock lock;
  
  if ((pFile->ctrlFlags & 3) == 1) {
    puVar1 = pFile->pInode;
    iVar2 = 0;
    if (puVar1->bProcessLock == '\0') {
      iVar2 = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6);
      if (-1 < iVar2) {
        puVar1->bProcessLock = '\x01';
        puVar1->nLock = puVar1->nLock + 1;
      }
    }
    return iVar2;
  }
  iVar2 = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6,pLock,aSyscall[7].pCurrent);
  return iVar2;
}

Assistant:

static int unixFileLock(unixFile *pFile, struct flock *pLock){
  int rc;
  unixInodeInfo *pInode = pFile->pInode;
  assert( unixMutexHeld() );
  assert( pInode!=0 );
  if( (pFile->ctrlFlags & (UNIXFILE_EXCL|UNIXFILE_RDONLY))==UNIXFILE_EXCL ){
    if( pInode->bProcessLock==0 ){
      struct flock lock;
      assert( pInode->nLock==0 );
      lock.l_whence = SEEK_SET;
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
      lock.l_type = F_WRLCK;
      rc = osFcntl(pFile->h, F_SETLK, &lock);
      if( rc<0 ) return rc;
      pInode->bProcessLock = 1;
      pInode->nLock++;
    }else{
      rc = 0;
    }
  }else{
    rc = osFcntl(pFile->h, F_SETLK, pLock);
  }
  return rc;
}